

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ForkHubBase::ForkHubBase
          (ForkHubBase *this,Own<kj::_::PromiseNode> *innerParam,ExceptionOrValue *resultRef)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  ExceptionOrValue *resultRef_local;
  Own<kj::_::PromiseNode> *innerParam_local;
  ForkHubBase *this_local;
  
  Refcounted::Refcounted(&this->super_Refcounted);
  Event::Event(&this->super_Event);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_005d27d8;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_005d2810;
  other = mv<kj::Own<kj::_::PromiseNode>>(innerParam);
  Own<kj::_::PromiseNode>::Own(&this->inner,other);
  this->resultRef = resultRef;
  this->headBranch = (ForkBranchBase *)0x0;
  this->tailBranch = &this->headBranch;
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->inner);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->inner);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,&this->super_Event);
  return;
}

Assistant:

ForkHubBase::ForkHubBase(Own<PromiseNode>&& innerParam, ExceptionOrValue& resultRef)
    : inner(kj::mv(innerParam)), resultRef(resultRef) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}